

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall ExpressionContext::AddType(ExpressionContext *this,TypeBase *type)

{
  ScopeData *pSVar1;
  TypeLookupResult value;
  TypeBase *local_18;
  
  local_18 = type;
  SmallArray<TypeBase_*,_2U>::push_back(&this->scope->types,&local_18);
  SmallArray<TypeBase_*,_128U>::push_back(&this->types,&local_18);
  if (((local_18 == (TypeBase *)0x0) || (local_18->typeID != 0x18)) ||
     (*(char *)((long)&local_18[3]._vptr_TypeBase + 1) == '\0')) {
    pSVar1 = this->scope;
    if (pSVar1->type == SCOPE_NAMESPACE) {
      pSVar1 = this->globalScope;
    }
    value.alias = (AliasData *)0x0;
    value.type = local_18;
    DirectChainedMap<TypeLookupResult>::insert(&pSVar1->typeLookupMap,local_18->nameHash,value);
  }
  return;
}

Assistant:

void ExpressionContext::AddType(TypeBase *type)
{
	scope->types.push_back(type);

	types.push_back(type);

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->isInternal)
			return;
	}

	// Namespaces are allowed only in global scope and namespaced type names are globally accessible through namespace name
	if(scope->type == SCOPE_NAMESPACE)
		globalScope->typeLookupMap.insert(type->nameHash, TypeLookupResult(type));
	else
		scope->typeLookupMap.insert(type->nameHash, TypeLookupResult(type));
}